

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O3

void fdsocket_close(Socket *s)

{
  Socket *e;
  undefined8 in_RAX;
  int fd;
  
  e = s + -0x412;
  if (s[-0x410].vt != (SocketVtable *)0x0) {
    (**(code **)(s[-0x410].vt)->plug)();
  }
  fd = (int)((ulong)in_RAX >> 0x20);
  if (-1 < *(int *)&e->vt) {
    del234(fdsocket_by_outfd,e);
    uxsel_del(fd);
    close(*(int *)&e->vt);
  }
  if (-1 < *(int *)((long)&s[-0x412].vt + 4)) {
    del234(fdsocket_by_infd,e);
    uxsel_del(fd);
    close(*(int *)((long)&s[-0x412].vt + 4));
  }
  if (-1 < *(int *)&s[-0x411].vt) {
    del234(fdsocket_by_inerrfd,e);
    uxsel_del(fd);
    close(*(int *)&s[-0x411].vt);
  }
  bufchain_clear((bufchain *)(s + -0x40a));
  bufchain_clear((bufchain *)(s + -0x40f));
  if ((SockAddr *)s[-3].vt != (SockAddr *)0x0) {
    sk_addr_free((SockAddr *)s[-3].vt);
  }
  delete_callbacks_for_context(e);
  safefree(e);
  return;
}

Assistant:

static void fdsocket_close(Socket *s)
{
    FdSocket *fds = container_of(s, FdSocket, sock);

    if (fds->opener)
        deferred_socket_opener_free(fds->opener);

    if (fds->outfd >= 0) {
        del234(fdsocket_by_outfd, fds);
        uxsel_del(fds->outfd);
        close(fds->outfd);
    }

    if (fds->infd >= 0) {
        del234(fdsocket_by_infd, fds);
        uxsel_del(fds->infd);
        close(fds->infd);
    }

    if (fds->inerrfd >= 0) {
        del234(fdsocket_by_inerrfd, fds);
        uxsel_del(fds->inerrfd);
        close(fds->inerrfd);
    }

    bufchain_clear(&fds->pending_input_data);
    bufchain_clear(&fds->pending_output_data);

    if (fds->addr)
        sk_addr_free(fds->addr);

    delete_callbacks_for_context(fds);

    sfree(fds);
}